

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::JitArenaAllocator>::Set(BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  BVIndex index;
  SparseBVUnit *this_00;
  BVIndex i_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  this_00 = BitsFromIndex(this,i,true);
  index = BVUnitT<unsigned_long>::Offset(i);
  BVUnitT<unsigned_long>::Set(this_00,index);
  return;
}

Assistant:

void
BVSparse<TAllocator>::Set(BVIndex i)
{
    this->BitsFromIndex(i)->Set(SparseBVUnit::Offset(i));
}